

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_notell(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  int iVar2;
  CHAR_DATA *txt;
  __type_conflict2 _Var3;
  CHAR_DATA *victim;
  char buf [4608];
  char arg [4608];
  CHAR_DATA *in_stack_ffffffffffffdbc8;
  char *in_stack_ffffffffffffdbd0;
  ulong uVar4;
  undefined4 in_stack_ffffffffffffdbd8;
  undefined4 in_stack_ffffffffffffdbdc;
  char *in_stack_ffffffffffffdbe0;
  char local_2418 [4608];
  char local_1218;
  int in_stack_ffffffffffffee1c;
  long in_stack_ffffffffffffee20;
  long in_stack_ffffffffffffee28;
  OBJ_DATA *in_stack_ffffffffffffee30;
  CHAR_DATA *in_stack_ffffffffffffee38;
  char *in_stack_ffffffffffffee40;
  char *in_stack_ffffffffffffffd0;
  CHAR_DATA *in_stack_ffffffffffffffd8;
  
  one_argument(in_stack_ffffffffffffdbd0,(char *)in_stack_ffffffffffffdbc8);
  if (local_1218 == '\0') {
    send_to_char(in_stack_ffffffffffffdbe0,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8));
  }
  else {
    txt = get_char_world(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    if (txt == (CHAR_DATA *)0x0) {
      send_to_char((char *)0x0,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffdbdc,in_stack_ffffffffffffdbd8));
    }
    else {
      iVar1 = get_trust(in_stack_ffffffffffffdbc8);
      iVar2 = get_trust(in_stack_ffffffffffffdbc8);
      if (iVar1 < iVar2) {
        uVar4 = txt->comm[0];
        _Var3 = std::pow<int,int>(0,0x595c2b);
        if ((uVar4 & (long)_Var3) == 0) {
          _Var3 = std::pow<int,int>(0,0x595ce9);
          txt->comm[0] = (long)_Var3 | txt->comm[0];
          send_to_char((char *)txt,(CHAR_DATA *)CONCAT44(iVar1,in_stack_ffffffffffffdbd8));
          send_to_char((char *)txt,(CHAR_DATA *)CONCAT44(iVar1,in_stack_ffffffffffffdbd8));
          sprintf(local_2418,"$N revokes %s\'s tells.",txt->name);
          wiznet(in_stack_ffffffffffffee40,in_stack_ffffffffffffee38,in_stack_ffffffffffffee30,
                 in_stack_ffffffffffffee28,in_stack_ffffffffffffee20,in_stack_ffffffffffffee1c);
        }
        else {
          _Var3 = std::pow<int,int>(0,0x595c51);
          txt->comm[0] = ((long)_Var3 ^ 0xffffffffffffffffU) & txt->comm[0];
          send_to_char((char *)txt,(CHAR_DATA *)CONCAT44(iVar1,in_stack_ffffffffffffdbd8));
          send_to_char((char *)txt,(CHAR_DATA *)CONCAT44(iVar1,in_stack_ffffffffffffdbd8));
          sprintf(local_2418,"$N restores tells to %s.",txt->name);
          wiznet(in_stack_ffffffffffffee40,in_stack_ffffffffffffee38,in_stack_ffffffffffffee30,
                 in_stack_ffffffffffffee28,in_stack_ffffffffffffee20,in_stack_ffffffffffffee1c);
        }
      }
      else {
        send_to_char((char *)txt,(CHAR_DATA *)CONCAT44(iVar1,in_stack_ffffffffffffdbd8));
      }
    }
  }
  return;
}

Assistant:

void do_notell(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH], buf[MAX_STRING_LENGTH];
	CHAR_DATA *victim;

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Notell whom?", ch);
		return;
	}

	victim = get_char_world(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (get_trust(victim) >= get_trust(ch))
	{
		send_to_char("You failed.\n\r", ch);
		return;
	}

	if (IS_SET(victim->comm, COMM_NOTELL))
	{
		REMOVE_BIT(victim->comm, COMM_NOTELL);

		send_to_char("You can tell again.\n\r", victim);
		send_to_char("NOTELL removed.\n\r", ch);

		sprintf(buf, "$N restores tells to %s.", victim->name);
		wiznet(buf, ch, nullptr, WIZ_PENALTIES, WIZ_SECURE, 0);
	}
	else
	{
		SET_BIT(victim->comm, COMM_NOTELL);

		send_to_char("You can't tell!\n\r", victim);
		send_to_char("NOTELL set.\n\r", ch);

		sprintf(buf, "$N revokes %s's tells.", victim->name);
		wiznet(buf, ch, nullptr, WIZ_PENALTIES, WIZ_SECURE, 0);
	}
}